

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_mul_2(mp_int *a,mp_int *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  mp_digit *pmVar4;
  mp_digit *pmVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  mp_digit *pmVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  if ((b->alloc <= a->used) && (iVar8 = mp_grow(b,a->used + 1), iVar8 != 0)) {
    return iVar8;
  }
  iVar8 = b->used;
  iVar1 = a->used;
  b->used = iVar1;
  pmVar4 = b->dp;
  iVar2 = a->used;
  pmVar9 = pmVar4;
  if (iVar2 < 1) {
    bVar7 = true;
  }
  else {
    pmVar5 = a->dp;
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar6 = pmVar5[lVar10];
      uVar11 = uVar6 * 2 & 0xffffffffffffffe | uVar12;
      uVar12 = uVar6 >> 0x3b;
      *pmVar9 = uVar11;
      pmVar9 = pmVar9 + 1;
      lVar10 = lVar10 + 1;
    } while (iVar2 != (int)lVar10);
    bVar7 = uVar6 >> 0x3b == 0;
  }
  if (!bVar7) {
    *pmVar9 = 1;
    b->used = iVar1 + 1;
  }
  uVar3 = b->used;
  if ((int)uVar3 < iVar8) {
    memset(pmVar4 + (int)uVar3,0,(ulong)(iVar8 + ~uVar3) * 8 + 8);
  }
  b->sign = a->sign;
  return 0;
}

Assistant:

int mp_mul_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* grow to accomodate result */
  if (b->alloc < a->used + 1) {
    if ((res = mp_grow (b, a->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;

  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* alias for source */
    tmpa = a->dp;
    
    /* alias for dest */
    tmpb = b->dp;

    /* carry */
    r = 0;
    for (x = 0; x < a->used; x++) {
    
      /* get what will be the *next* carry bit from the 
       * MSB of the current digit 
       */
      rr = *tmpa >> ((mp_digit)(DIGIT_BIT - 1));
      
      /* now shift up this digit, add in the carry [from the previous] */
      *tmpb++ = ((*tmpa++ << ((mp_digit)1)) | r) & MP_MASK;
      
      /* copy the carry that would be from the source 
       * digit into the next iteration 
       */
      r = rr;
    }

    /* new leading digit? */
    if (r != 0) {
      /* add a MSB which is always 1 at this point */
      *tmpb = 1;
      ++(b->used);
    }

    /* now zero any excess digits on the destination 
     * that we didn't write to 
     */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  return MP_OKAY;
}